

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O2

Hop_Obj_t *
Nwk_NodeIfToHop2_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  void **ppvVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pHVar3;
  int iVar4;
  If_Obj_t *pIVar5;
  uint uVar6;
  
  if (*(Hop_Obj_t **)&pIfObj->CutBest != (Hop_Obj_t *)0x0) {
    return *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  iVar4 = vVisited->nSize;
  if (iVar4 == vVisited->nCap) {
    uVar6 = 0x10;
    if (0xf < iVar4) {
      uVar6 = iVar4 * 2;
    }
    if (iVar4 < (int)uVar6) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar1 = (void **)malloc((ulong)uVar6 << 3);
      }
      else {
        ppvVar1 = (void **)realloc(vVisited->pArray,(ulong)uVar6 << 3);
        iVar4 = vVisited->nSize;
      }
      vVisited->pArray = ppvVar1;
      vVisited->nCap = uVar6;
    }
  }
  vVisited->nSize = iVar4 + 1;
  vVisited->pArray[iVar4] = &pIfObj->CutBest;
  (pIfObj->CutBest).Area = 1.4013e-45;
  (pIfObj->CutBest).Edge = 0.0;
  pIVar5 = pIfObj;
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) == (undefined1  [112])0x2) {
    pHVar2 = (Hop_Obj_t *)0x1;
  }
  else {
    for (; pIVar5 != (If_Obj_t *)0x0; pIVar5 = pIVar5->pEquiv) {
      pHVar2 = Nwk_NodeIfToHop2_rec(pHopMan,pIfMan,pIVar5->pFanin0,vVisited);
      if ((pHVar2 != (Hop_Obj_t *)0x1) &&
         (pHVar3 = Nwk_NodeIfToHop2_rec(pHopMan,pIfMan,pIVar5->pFanin1,vVisited),
         pHVar3 != (Hop_Obj_t *)0x1)) {
        pHVar3 = Hop_And(pHopMan,(Hop_Obj_t *)((ulong)(*(uint *)pIVar5 >> 4 & 1) ^ (ulong)pHVar2),
                         (Hop_Obj_t *)((ulong)(*(uint *)pIVar5 >> 5 & 1) ^ (ulong)pHVar3));
        pHVar2 = (Hop_Obj_t *)((ulong)pHVar3 ^ 1);
        if (((*(uint *)pIfObj ^ *(uint *)pIVar5) & 0x40) == 0) {
          pHVar2 = pHVar3;
        }
        *(Hop_Obj_t **)&pIfObj->CutBest = pHVar2;
        return pHVar2;
      }
    }
    pHVar2 = *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  return pHVar2;
}

Assistant:

static inline void *     If_CutData( If_Cut_t * pCut )                       { return *(void **)pCut;                }